

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O3

int Kit_DsdCountAigNodes_rec(Kit_DsdNtk_t *pNtk,int Id)

{
  ushort uVar1;
  Kit_DsdObj_t KVar2;
  Kit_DsdObj_t *pKVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  
  if (-1 < Id) {
    uVar1 = pNtk->nVars;
    if ((uint)Id < (uint)pNtk->nNodes + (uint)uVar1) {
      iVar6 = 0;
      iVar5 = 0;
      if (((uint)uVar1 <= (uint)Id) &&
         (pKVar3 = pNtk->pNodes[(long)Id - (ulong)uVar1], iVar5 = iVar6,
         pKVar3 != (Kit_DsdObj_t *)0x0)) {
        KVar2 = *pKVar3;
        uVar7 = (uint)KVar2 >> 6 & 7;
        if ((1 < uVar7 - 1) && (0x7ffffff < (uint)KVar2)) {
          uVar4 = (uint)KVar2 >> 0x1a;
          if (uVar7 == 5) {
            iVar5 = 3;
            if (uVar4 != 3) {
              __assert_fail("(int)pObj->nFans == 3",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                            ,0x743,"int Kit_DsdCountAigNodes_rec(Kit_DsdNtk_t *, int)");
            }
          }
          else if (uVar7 == 4) {
            iVar5 = uVar4 * 3 + -3;
          }
          else {
            if (uVar7 != 3) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                            ,0x746,"int Kit_DsdCountAigNodes_rec(Kit_DsdNtk_t *, int)");
            }
            iVar5 = uVar4 - 1;
          }
          uVar8 = 0;
          do {
            iVar6 = Kit_DsdCountAigNodes_rec
                              (pNtk,(uint)(*(ushort *)((long)&pKVar3[1].field_0x0 + uVar8 * 2) >> 1)
                              );
            iVar5 = iVar5 + iVar6;
            uVar8 = uVar8 + 1;
          } while (uVar8 < (uint)*pKVar3 >> 0x1a);
        }
      }
      return iVar5;
    }
  }
  __assert_fail("Id >= 0 && Id < pNtk->nVars + pNtk->nNodes",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kit.h"
                ,0x99,"Kit_DsdObj_t *Kit_DsdNtkObj(Kit_DsdNtk_t *, int)");
}

Assistant:

int Kit_DsdCountAigNodes_rec( Kit_DsdNtk_t * pNtk, int Id )
{
    Kit_DsdObj_t * pObj;
    unsigned iLit, i, RetValue = 0;
    pObj = Kit_DsdNtkObj( pNtk, Id );
    if ( pObj == NULL )
        return 0;
    if ( pObj->Type == KIT_DSD_CONST1 || pObj->Type == KIT_DSD_VAR )
        return 0;
    if ( pObj->nFans < 2 ) // why this happens? - need to figure out
        return 0; 
    assert( pObj->nFans > 1 );
    if ( pObj->Type == KIT_DSD_AND )
        RetValue = ((int)pObj->nFans - 1);
    else if ( pObj->Type == KIT_DSD_XOR )
        RetValue = ((int)pObj->nFans - 1) * 3;
    else if ( pObj->Type == KIT_DSD_PRIME )
    {
        // assuming MUX decomposition
        assert( (int)pObj->nFans == 3 );
        RetValue = 3;
    }
    else assert( 0 );
    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        RetValue += Kit_DsdCountAigNodes_rec( pNtk, Abc_Lit2Var(iLit) );
    return RetValue;
}